

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManMappingVerify_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pObj_00;
  uint local_30;
  int local_2c;
  int Result;
  int k;
  int iFan;
  int Id;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  local_30 = 1;
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsAndNotBuf(pObj);
    if (iVar1 == 0) {
      p_local._4_4_ = 1;
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Gia_ObjIsLut(p,iVar1);
      if (iVar1 == 0) {
        uVar2 = Gia_ObjId(p,pObj);
        Abc_Print(-1,"Gia_ManMappingVerify: Internal node %d does not have mapping.\n",(ulong)uVar2)
        ;
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Gia_ObjId(p,pObj);
        for (local_2c = 0; iVar3 = Gia_ObjLutSize(p,iVar1), local_2c < iVar3;
            local_2c = local_2c + 1) {
          piVar4 = Gia_ObjLutFanins(p,iVar1);
          if (local_30 != 0) {
            pObj_00 = Gia_ManObj(p,piVar4[local_2c]);
            uVar2 = Gia_ManMappingVerify_rec(p,pObj_00);
            local_30 = uVar2 & local_30;
          }
        }
        p_local._4_4_ = local_30;
      }
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManMappingVerify_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Id, iFan, k, Result = 1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( !Gia_ObjIsAndNotBuf(pObj) )
        return 1;
    if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        Abc_Print( -1, "Gia_ManMappingVerify: Internal node %d does not have mapping.\n", Gia_ObjId(p, pObj) );
        return 0;
    }
    Id = Gia_ObjId(p, pObj);
    Gia_LutForEachFanin( p, Id, iFan, k )
        if ( Result )
            Result &= Gia_ManMappingVerify_rec( p, Gia_ManObj(p, iFan) );
    return Result;
}